

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

int16_t bf_peek_int16_be(bfile_t *bfile)

{
  undefined1 auVar1 [16];
  int16_t iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = bfile->pos;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  auVar1 = auVar1 % ZEXT416(bfile->buffer_size);
  if ((auVar1._0_8_ == 0) && (uVar3 == bfile->ipos)) {
    bf_read_buffer(bfile);
    uVar3 = bfile->pos;
  }
  if (bfile->ipos - 2 < uVar3) {
    bf_peek_int16_be_cold_1();
    iVar2 = 0;
  }
  else {
    iVar4 = auVar1._0_4_;
    iVar2 = CONCAT11(bfile->buffer[iVar4],bfile->buffer[(int)((iVar4 + 1U) % bfile->buffer_size)]);
  }
  return iVar2;
}

Assistant:

int16_t
bf_peek_int16_be(
    bfile_t * bfile )
{
    int16_t value;
    int bufoff;
    int8_t * buffer;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next int16.\n" );
        return 0;
    }

    buffer = (int8_t *) bfile->buffer;
    value = buffer[bufoff] << 8;
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | bfile->buffer[bufoff];

    return value;
}